

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageField
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  bool bVar1;
  FieldDescriptorProto_Label local_3c;
  LocationRecorder *pLStack_38;
  Label label;
  LocationRecorder *field_location_local;
  LocationRecorder *pLStack_28;
  int location_field_number_for_nested_type_local;
  LocationRecorder *parent_location_local;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  pLStack_38 = field_location;
  field_location_local._4_4_ = location_field_number_for_nested_type;
  pLStack_28 = parent_location;
  parent_location_local = (LocationRecorder *)messages;
  messages_local = (RepeatedPtrField<google::protobuf::DescriptorProto> *)field;
  field_local = (FieldDescriptorProto *)this;
  bVar1 = ParseLabel(this,&local_3c,field_location,containing_file);
  if (((bVar1) &&
      (FieldDescriptorProto::set_label((FieldDescriptorProto *)messages_local,local_3c),
      local_3c == FieldDescriptorProto_Label_LABEL_OPTIONAL)) &&
     (bVar1 = std::operator==(&this->syntax_identifier_,"proto3"), bVar1)) {
    FieldDescriptorProto::set_proto3_optional((FieldDescriptorProto *)messages_local,true);
  }
  bVar1 = ParseMessageFieldNoLabel
                    (this,(FieldDescriptorProto *)messages_local,
                     (RepeatedPtrField<google::protobuf::DescriptorProto> *)parent_location_local,
                     pLStack_28,field_location_local._4_4_,pLStack_38,containing_file);
  return bVar1;
}

Assistant:

bool Parser::ParseMessageField(FieldDescriptorProto* field,
                               RepeatedPtrField<DescriptorProto>* messages,
                               const LocationRecorder& parent_location,
                               int location_field_number_for_nested_type,
                               const LocationRecorder& field_location,
                               const FileDescriptorProto* containing_file) {
  {
    FieldDescriptorProto::Label label;
    if (ParseLabel(&label, field_location, containing_file)) {
      field->set_label(label);
      if (label == FieldDescriptorProto::LABEL_OPTIONAL &&
          syntax_identifier_ == "proto3") {
        field->set_proto3_optional(true);
      }
    }
  }

  return ParseMessageFieldNoLabel(field, messages, parent_location,
                                  location_field_number_for_nested_type,
                                  field_location, containing_file);
}